

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cc
# Opt level: O3

void __thiscall hrvo::Agent::Agent(Agent *this,Simulator *simulator)

{
  _Rb_tree_header *p_Var1;
  
  this->simulator_ = simulator;
  Vector2::Vector2(&this->newVelocity_);
  Vector2::Vector2(&this->position_);
  Vector2::Vector2(&this->prefVelocity_);
  Vector2::Vector2(&this->velocity_);
  p_Var1 = &(this->candidates_)._M_t._M_impl.super__Rb_tree_header;
  (this->candidates_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->candidates_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->goalNo_ = 0;
  this->maxNeighbors_ = 0;
  this->goalRadius_ = 0.0;
  this->maxAccel_ = 0.0;
  this->maxSpeed_ = 0.0;
  this->neighborDist_ = 0.0;
  this->orientation_ = 0.0;
  this->prefSpeed_ = 0.0;
  this->radius_ = 0.0;
  this->uncertaintyOffset_ = 0.0;
  this->reachedGoal_ = false;
  (this->candidates_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->candidates_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->candidates_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->neighbors_)._M_t._M_impl.super__Rb_tree_header;
  (this->neighbors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->neighbors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->neighbors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->neighbors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->neighbors_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->velocityObstacles_).
  super__Vector_base<hrvo::Agent::VelocityObstacle,_std::allocator<hrvo::Agent::VelocityObstacle>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->velocityObstacles_).
  super__Vector_base<hrvo::Agent::VelocityObstacle,_std::allocator<hrvo::Agent::VelocityObstacle>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->velocityObstacles_).
  super__Vector_base<hrvo::Agent::VelocityObstacle,_std::allocator<hrvo::Agent::VelocityObstacle>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Agent::Agent(Simulator *simulator)
    : simulator_(simulator),
      goalNo_(0U),
      maxNeighbors_(0U),
      goalRadius_(0.0F),
      maxAccel_(0.0F),
      maxSpeed_(0.0F),
      neighborDist_(0.0F),
      orientation_(0.0F),
      prefSpeed_(0.0F),
      radius_(0.0F),
      uncertaintyOffset_(0.0F),
#if HRVO_DIFFERENTIAL_DRIVE
      leftWheelSpeed_(0.0F),
      rightWheelSpeed_(0.0F),
      timeToOrientation_(0.0F),
      wheelTrack_(0.0F),
#endif /* HRVO_DIFFERENTIAL_DRIVE */
      reachedGoal_(false) {
}